

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init_1.c
# Opt level: O2

void spmd(void)

{
  bsp_pid_t bVar1;
  
  bVar1 = bsp_nprocs();
  bsp_begin(bVar1);
  bVar1 = bsp_pid();
  if ((bVar1 == 0) && (s_some_int != 5)) {
    printf("TEST FAILED: Expected %s implies %s but %s = %d and %s = %d\n   /workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/test/init_1.c:%d\n"
           ,"s==0","s_some_int == 5","s==0",1,"s_some_int == 5",0,0xc);
    abort();
  }
  s_some_int = 999;
  if (bVar1 == 0) {
    s_some_int = -10;
  }
  bsp_end();
  return;
}

Assistant:

void spmd(void)
{
    bsp_pid_t s;
    bsp_begin( bsp_nprocs() );

    s = bsp_pid();
    EXPECT_IMPLIES( s==0, s_some_int == 5 );

    if (s == 0 )
        s_some_int = (int) s - 10;
    else
        s_some_int = 999;

    bsp_end();
}